

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NinjaBuildCommand.cpp
# Opt level: O0

bool __thiscall
llbuild::commands::executeNinjaBuildCommand(std::vector<std::__cxx11::string,std::allocator<std::
__cxx11::string>>)::NinjaCompositeResultRule::isResultValid(llbuild::core::BuildEngine&,std::
vector<unsigned_char,std::allocator<unsigned_char>_>_const__
          (void *this,BuildEngine *param_1,ValueType *value)

{
  ValueType *value_local;
  BuildEngine *param_1_local;
  NinjaCompositeResultRule *this_local;
  
  if ((*(byte *)(*(long *)((long)this + 0x30) + 0x91) & 1) == 0) {
    this_local._7_1_ =
         anon_unknown.dwarf_83ee8::selectCompositeIsResultValid
                   (*(Command **)((long)this + 0x38),value);
  }
  else {
    this_local._7_1_ = true;
  }
  return this_local._7_1_;
}

Assistant:

bool isResultValid(core::BuildEngine&, const core::ValueType& value) override {
        // If simulating, assume cached results are valid.
        if (context.simulate)
          return true;

        return selectCompositeIsResultValid(command, value);
      }